

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O2

bool midi_processor::process_riff_midi
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  size_t length;
  size_t length_00;
  size_t length_01;
  const_iterator it1;
  pointer puVar9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_buffer;
  string field;
  midi_meta_data meta_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> midi_file;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  midi_container *local_d8;
  char *local_d0;
  undefined8 local_c8;
  char local_c0 [16];
  pointer local_b0;
  midi_meta_data local_a8;
  midi_meta_data_item local_78;
  
  puVar9 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b0 = puVar9 + (ulong)*(uint *)(puVar9 + 4) + 8;
  it1._M_current = puVar9 + 0xc;
  local_a8.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.m_data.super__Vector_base<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.m_bitmap.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_data.super__Vector_base<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_data.super__Vector_base<midi_meta_data_item,_std::allocator<midi_meta_data_item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar4 = false;
  bVar6 = false;
  puVar9 = local_b0;
  local_d8 = p_out;
LAB_0010e3f8:
  do {
    if (it1._M_current == puVar9) goto LAB_0010e6d3;
    if ((long)puVar9 - (long)it1._M_current < 8) {
LAB_0010e6e6:
      bVar6 = false;
      goto LAB_0010e6e8;
    }
    uVar2 = *(uint *)(it1._M_current + 4);
    uVar7 = (ulong)uVar2;
    if ((ulong)((long)puVar9 - (long)it1._M_current) < uVar7) goto LAB_0010e6e6;
    bVar5 = it_equal(it1,"data",uVar7);
    if (bVar5) {
      if (bVar6) goto LAB_0010e6e6;
      local_78.m_name._M_string_length = 0;
      local_78.m_timestamp = 0;
      local_78.m_name._M_dataplus._M_p = (pointer)0x0;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,it1._M_current + 8
                 ,it1._M_current + uVar7 + 8);
      bVar6 = process_standard_midi
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,local_d8
                        );
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
      if (!bVar6) goto LAB_0010e6e6;
      it1._M_current =
           it1._M_current + (uVar2 + 8) + (it1._M_current + (uVar2 + 8) != puVar9 & (byte)uVar2);
      bVar6 = true;
    }
    else {
      bVar5 = it_equal(it1,"DISP",length);
      if (bVar5) {
        if (*(int *)(it1._M_current + 8) == 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
                     (ulong)(uVar2 - 3));
          if (uVar2 != 4) {
            memmove(local_f8._M_impl.super__Vector_impl_data._M_start,it1._M_current + 0xc,uVar7 - 4
                   );
          }
          local_f8._M_impl.super__Vector_impl_data._M_start[uVar2 - 4] = '\0';
          midi_meta_data_item::midi_meta_data_item
                    (&local_78,0,"display_name",
                     (char *)local_f8._M_impl.super__Vector_impl_data._M_start);
          midi_meta_data::add_item(&local_a8,&local_78);
          midi_meta_data_item::~midi_meta_data_item(&local_78);
        }
        uVar7 = (ulong)(uVar2 + 8);
LAB_0010e61a:
        puVar9 = it1._M_current + uVar7;
      }
      else {
        bVar5 = it_equal(it1,"LIST",length_00);
        if (!bVar5) goto LAB_0010e61a;
        bVar5 = it_equal((const_iterator)(it1._M_current + 8),"INFO",length_01);
        if (((!bVar5) || (bVar4)) ||
           (puVar9 = it1._M_current + uVar7 + 8, (long)puVar9 - (long)it1._M_current < 0xc))
        goto LAB_0010e6e6;
        for (__first._M_current = it1._M_current + 0xc; __first._M_current != puVar9;
            __first._M_current =
                 __first._M_current + (uVar3 + 8) +
                 (__first._M_current + (uVar3 + 8) != puVar9 & (byte)uVar3)) {
          if ((long)puVar9 - (long)__first._M_current < 4) goto LAB_0010e6e6;
          uVar3 = *(uint *)(__first._M_current + 4);
          uVar7 = (ulong)uVar3;
          if ((ulong)((long)puVar9 - (long)__first._M_current) < (ulong)(uVar3 + 8))
          goto LAB_0010e6e6;
          local_d0 = local_c0;
          local_c8 = 0;
          local_c0[0] = '\0';
          std::__cxx11::string::
          assign<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((string *)&local_d0,__first,
                     (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(__first._M_current + 4));
          lVar8 = 0;
          do {
            if (lVar8 + 0x10 == 0x150) goto LAB_0010e59e;
            puVar1 = (undefined8 *)((long)riff_tag_mappings[0] + lVar8);
            lVar8 = lVar8 + 0x10;
          } while (*(int *)__first._M_current != *(int *)*puVar1);
          std::__cxx11::string::assign((char *)&local_d0);
LAB_0010e59e:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
                     (ulong)(uVar3 + 1));
          if (uVar7 != 0) {
            memmove(local_f8._M_impl.super__Vector_impl_data._M_start,__first._M_current + 8,uVar7);
          }
          local_f8._M_impl.super__Vector_impl_data._M_start[uVar7] = '\0';
          midi_meta_data_item::midi_meta_data_item
                    (&local_78,0,local_d0,(char *)local_f8._M_impl.super__Vector_impl_data._M_start)
          ;
          midi_meta_data::add_item(&local_a8,&local_78);
          midi_meta_data_item::~midi_meta_data_item(&local_78);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        bVar4 = true;
      }
      it1._M_current = puVar9 + (puVar9 != local_b0 & (byte)uVar2);
      puVar9 = local_b0;
      if (!bVar6) goto LAB_0010e3f8;
    }
    if (bVar4) {
LAB_0010e6d3:
      bVar6 = true;
      midi_container::set_extra_meta_data(local_d8,&local_a8);
LAB_0010e6e8:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
      midi_meta_data::~midi_meta_data(&local_a8);
      return bVar6;
    }
  } while( true );
}

Assistant:

bool midi_processor::process_riff_midi( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint32_t file_size = p_file[ 4 ] | ( p_file[ 5 ] << 8 ) | ( p_file[ 6 ] << 16 ) | ( p_file[ 7 ] << 24 );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 12;

    std::vector<uint8_t>::const_iterator body_end = p_file.begin() + 8 + file_size;

    bool found_data = false;
    bool found_info = false;

    midi_meta_data meta_data;

    std::vector<uint8_t> extra_buffer;

    while ( it != body_end )
    {
        if ( body_end - it < 8 ) return false;
        uint32_t chunk_size = toInt32LE( it + 4 );
        if ( (unsigned long)(body_end - it) < chunk_size ) return false;
        if ( it_equal( it, "data", 4 ) )
        {
            if ( !found_data )
            {
                std::vector<uint8_t> midi_file;
                midi_file.assign( it + 8, it + 8 + chunk_size );
                if ( !process_standard_midi( midi_file, p_out ) ) return false;
                found_data = true;
            }
            else return false; /*throw exception_io_data( "Multiple RIFF data chunks found" );*/
            it += 8 + chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else if ( it_equal( it, "DISP", 4 ) )
        {
            uint32_t type = toInt32LE( it + 8 );
            if ( type == 1 )
            {
                extra_buffer.resize( chunk_size - 4 + 1 );
                std::copy( it + 12, it + 8 + chunk_size, extra_buffer.begin() );
				extra_buffer[ chunk_size - 4 ] = '\0';
                meta_data.add_item( midi_meta_data_item( 0, "display_name", (const char *) &extra_buffer[0] ) );
            }
            it += 8 + chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else if ( it_equal( it, "LIST", 4 ) )
        {
            std::vector<uint8_t>::const_iterator chunk_end = it + 8 + chunk_size;
            if ( it_equal( it + 8, "INFO", 4 ) )
            {
                if ( !found_info )
                {
                    if ( chunk_end - it < 12 ) return false;
                    it += 12;
                    while ( it != chunk_end )
                    {
                        if ( chunk_end - it < 4 ) return false;
                        uint32_t field_size = toInt32LE( it + 4 );
                        if ( (unsigned long)(chunk_end - it) < 8 + field_size ) return false;
                        std::string field;
                        field.assign( it, it + 4 );
                        for ( unsigned i = 0; i < _countof(riff_tag_mappings); ++i )
                        {
                            if ( !memcmp( &it[0], riff_tag_mappings[ i ][ 0 ], 4 ) )
                            {
                                field = riff_tag_mappings[ i ][ 1 ];
                                break;
                            }
                        }
                        extra_buffer.resize( field_size + 1 );
                        std::copy( it + 8, it + 8 + field_size, extra_buffer.begin() );
						extra_buffer[ field_size ] = '\0';
                        it += 8 + field_size;
                        meta_data.add_item( midi_meta_data_item( 0, field.c_str(), ( const char * ) &extra_buffer[0] ) );
                        if ( field_size & 1 && it != chunk_end ) ++it;
                    }
                    found_info = true;
                }
                else return false; /*throw exception_io_data( "Multiple RIFF LIST INFO chunks found" );*/
            }
            else return false; /* unknown LIST chunk */
            it = chunk_end;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
        else
        {
            it += chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }

        if ( found_data && found_info ) break;
    }

    p_out.set_extra_meta_data( meta_data );

    return true;
}